

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall Assimp::FBXExporter::WriteAsciiHeader(FBXExporter *this)

{
  ostream *poVar1;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  string *psVar5;
  string local_1c8 [8];
  string ascii_header;
  stringstream local_198 [8];
  stringstream head;
  ostream local_188 [376];
  FBXExporter *local_10;
  FBXExporter *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"; FBX ");
  poVar1 = std::operator<<(poVar1,(string *)FBX::EXPORT_VERSION_STR_abi_cxx11_);
  std::operator<<(poVar1," project file\n");
  std::operator<<(local_188,"; Created by the Open Asset Import Library (Assimp)\n");
  std::operator<<(local_188,"; http://assimp.org\n");
  std::operator<<(local_188,"; -------------------------------------------------\n");
  std::__cxx11::stringstream::str();
  peVar2 = std::__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->outfile);
  psVar5 = local_1c8;
  uVar3 = std::__cxx11::string::c_str();
  uVar4 = std::__cxx11::string::size();
  (*peVar2->_vptr_IOStream[3])(peVar2,uVar3,uVar4,1,in_R8,in_R9,psVar5);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void FBXExporter::WriteAsciiHeader()
{
    // basically just a comment at the top of the file
    std::stringstream head;
    head << "; FBX " << EXPORT_VERSION_STR << " project file\n";
    head << "; Created by the Open Asset Import Library (Assimp)\n";
    head << "; http://assimp.org\n";
    head << "; -------------------------------------------------\n";
    const std::string ascii_header = head.str();
    outfile->Write(ascii_header.c_str(), ascii_header.size(), 1);
}